

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  undefined4 uVar3;
  size_t sVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  bool bVar66;
  byte bVar67;
  int iVar68;
  AABBNodeMB4D *node1;
  byte bVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  ulong uVar74;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar75;
  size_t sVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  uint uVar80;
  byte bVar81;
  undefined4 uVar82;
  uint uVar83;
  NodeRef root;
  NodeRef *pNVar84;
  byte bVar85;
  ulong uVar86;
  ulong uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar111 [16];
  float fVar114;
  vint4 ai_2;
  undefined1 auVar115 [16];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar123;
  float fVar124;
  vint4 ai_3;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  vint4 bi_1;
  undefined1 auVar129 [16];
  float fVar132;
  vint4 bi_3;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  vint4 bi_2;
  undefined1 auVar136 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar138 [16];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  uint local_1a58;
  Precalculations pre;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined1 local_1998 [16];
  BVH *local_1980;
  Intersectors *local_1978;
  long local_1970;
  Vec3<embree::vfloat_impl<4>_> p0;
  vint<4> itime;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18a8;
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  TravRayK<4,_false> tray;
  undefined8 local_1718;
  undefined8 uStack_1710;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1980 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1980->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar92 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar98 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar98,5);
    uVar86 = vpcmpeqd_avx512vl(auVar92,(undefined1  [16])valid_i->field_0);
    uVar86 = ((byte)uVar11 & 0xf) & uVar86;
    bVar85 = (byte)uVar86;
    if (bVar85 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar89._8_4_ = 0x7fffffff;
      auVar89._0_8_ = 0x7fffffff7fffffff;
      auVar89._12_4_ = 0x7fffffff;
      auVar92 = vandps_avx(auVar89,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar88._8_4_ = 0x219392ef;
      auVar88._0_8_ = 0x219392ef219392ef;
      auVar88._12_4_ = 0x219392ef;
      uVar87 = vcmpps_avx512vl(auVar92,auVar88,1);
      bVar66 = (bool)((byte)uVar87 & 1);
      auVar90._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._0_4_;
      bVar66 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar90._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._4_4_;
      bVar66 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar90._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._8_4_;
      bVar66 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar90._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._12_4_;
      auVar92 = vandps_avx(auVar89,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar87 = vcmpps_avx512vl(auVar92,auVar88,1);
      bVar66 = (bool)((byte)uVar87 & 1);
      auVar91._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._16_4_;
      bVar66 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar91._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._20_4_;
      bVar66 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar91._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._24_4_;
      bVar66 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar91._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._28_4_;
      auVar92 = vandps_avx(auVar89,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar87 = vcmpps_avx512vl(auVar92,auVar88,1);
      bVar66 = (bool)((byte)uVar87 & 1);
      auVar92._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._32_4_;
      bVar66 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar92._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._36_4_;
      bVar66 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar92._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._40_4_;
      bVar66 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar92._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._44_4_;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar145 = ZEXT1664(auVar88);
      auVar89 = vrcp14ps_avx512vl(auVar90);
      auVar90 = vfnmadd213ps_avx512vl(auVar90,auVar89,auVar88);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar90,auVar89,auVar89)
      ;
      auVar90 = vrcp14ps_avx512vl(auVar91);
      auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar90,auVar88);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar91,auVar90,auVar90)
      ;
      auVar90 = vrcp14ps_avx512vl(auVar92);
      auVar92 = vfnmadd213ps_avx512vl(auVar92,auVar90,auVar88);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar92,auVar90,auVar90)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar87 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar98,1);
      auVar92 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar87 & 1) * auVar92._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar87 >> 1) & 1) * auVar92._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar87 >> 2) & 1) * auVar92._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar87 >> 3) & 1) * auVar92._12_4_;
      uVar87 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar98,5);
      auVar92 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar66 = (bool)((byte)uVar87 & 1);
      bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar66 * auVar92._0_4_ | (uint)!bVar66 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar8 * auVar92._4_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar9 * auVar92._8_4_ | (uint)!bVar9 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * 0x30;
      uVar87 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar98,5);
      auVar92 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar66 = (bool)((byte)uVar87 & 1);
      bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar66 * auVar92._0_4_ | (uint)!bVar66 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar8 * auVar92._4_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar9 * auVar92._8_4_ | (uint)!bVar9 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar146 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar92 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar98);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar85 & 1) * auVar92._0_4_ |
           (uint)!(bool)(bVar85 & 1) * stack_near[0].field_0._0_4_;
      bVar66 = (bool)((byte)(uVar86 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * stack_near[0].field_0._4_4_;
      bVar66 = (bool)((byte)(uVar86 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * stack_near[0].field_0._8_4_;
      bVar66 = SUB81(uVar86 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * stack_near[0].field_0._12_4_;
      auVar92 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar98);
      tray.tfar.field_0.i[0] =
           (uint)(bVar85 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar85 & 1) * -0x800000;
      bVar66 = (bool)((byte)(uVar86 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)((byte)(uVar86 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = SUB81(uVar86 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar80 = 3;
      }
      else {
        uVar80 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_1a58 = (byte)((ushort)((short)uVar86 << 0xc) >> 0xc) ^ 0xf;
      pNVar84 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar75 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar92 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar147 = ZEXT1664(auVar92);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar148 = ZEXT1664(auVar92);
      local_1978 = This;
LAB_01c8e176:
      do {
        do {
          root.ptr = pNVar84[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8efe0;
          pNVar84 = pNVar84 + -1;
          paVar75 = paVar75 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar75->v;
          auVar143 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar86 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar86 == '\0');
        uVar82 = (undefined4)uVar86;
        if (uVar80 < (uint)POPCOUNT(uVar82)) {
LAB_01c8e1b6:
          do {
            lVar71 = -0x10;
            uVar83 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c8efe0;
              uVar11 = vcmpps_avx512vl(auVar143._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_01c8e176;
              local_1970 = (ulong)(uVar83 & 0xf) - 8;
              bVar67 = ~(byte)local_1a58 & 0xf;
              lVar71 = 0;
              goto LAB_01c8e4f3;
            }
            uVar11 = vcmpps_avx512vl(auVar143._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar86 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar92 = auVar146._0_16_;
            for (; (auVar143 = ZEXT1664(auVar92), lVar71 != 0 &&
                   (sVar4 = *(size_t *)(uVar86 + 0x20 + lVar71 * 2), sVar4 != 8));
                lVar71 = lVar71 + 4) {
              uVar82 = *(undefined4 *)(uVar86 + 0x90 + lVar71);
              auVar116._4_4_ = uVar82;
              auVar116._0_4_ = uVar82;
              auVar116._8_4_ = uVar82;
              auVar116._12_4_ = uVar82;
              auVar98 = *(undefined1 (*) [16])(ray + 0x70);
              uVar82 = *(undefined4 *)(uVar86 + 0x30 + lVar71);
              auVar15._4_4_ = uVar82;
              auVar15._0_4_ = uVar82;
              auVar15._8_4_ = uVar82;
              auVar15._12_4_ = uVar82;
              auVar90 = vfmadd213ps_avx512vl(auVar116,auVar98,auVar15);
              uVar82 = *(undefined4 *)(uVar86 + 0xb0 + lVar71);
              auVar118._4_4_ = uVar82;
              auVar118._0_4_ = uVar82;
              auVar118._8_4_ = uVar82;
              auVar118._12_4_ = uVar82;
              uVar82 = *(undefined4 *)(uVar86 + 0x50 + lVar71);
              auVar16._4_4_ = uVar82;
              auVar16._0_4_ = uVar82;
              auVar16._8_4_ = uVar82;
              auVar16._12_4_ = uVar82;
              auVar91 = vfmadd213ps_avx512vl(auVar118,auVar98,auVar16);
              uVar82 = *(undefined4 *)(uVar86 + 0xd0 + lVar71);
              auVar121._4_4_ = uVar82;
              auVar121._0_4_ = uVar82;
              auVar121._8_4_ = uVar82;
              auVar121._12_4_ = uVar82;
              uVar82 = *(undefined4 *)(uVar86 + 0x70 + lVar71);
              auVar17._4_4_ = uVar82;
              auVar17._0_4_ = uVar82;
              auVar17._8_4_ = uVar82;
              auVar17._12_4_ = uVar82;
              auVar93 = vfmadd213ps_avx512vl(auVar121,auVar98,auVar17);
              uVar82 = *(undefined4 *)(uVar86 + 0xa0 + lVar71);
              auVar126._4_4_ = uVar82;
              auVar126._0_4_ = uVar82;
              auVar126._8_4_ = uVar82;
              auVar126._12_4_ = uVar82;
              uVar82 = *(undefined4 *)(uVar86 + 0x40 + lVar71);
              auVar18._4_4_ = uVar82;
              auVar18._0_4_ = uVar82;
              auVar18._8_4_ = uVar82;
              auVar18._12_4_ = uVar82;
              auVar94 = vfmadd213ps_avx512vl(auVar126,auVar98,auVar18);
              uVar82 = *(undefined4 *)(uVar86 + 0xc0 + lVar71);
              auVar129._4_4_ = uVar82;
              auVar129._0_4_ = uVar82;
              auVar129._8_4_ = uVar82;
              auVar129._12_4_ = uVar82;
              uVar82 = *(undefined4 *)(uVar86 + 0x60 + lVar71);
              auVar19._4_4_ = uVar82;
              auVar19._0_4_ = uVar82;
              auVar19._8_4_ = uVar82;
              auVar19._12_4_ = uVar82;
              auVar95 = vfmadd213ps_avx512vl(auVar129,auVar98,auVar19);
              uVar82 = *(undefined4 *)(uVar86 + 0xe0 + lVar71);
              auVar133._4_4_ = uVar82;
              auVar133._0_4_ = uVar82;
              auVar133._8_4_ = uVar82;
              auVar133._12_4_ = uVar82;
              uVar82 = *(undefined4 *)(uVar86 + 0x80 + lVar71);
              auVar20._4_4_ = uVar82;
              auVar20._0_4_ = uVar82;
              auVar20._8_4_ = uVar82;
              auVar20._12_4_ = uVar82;
              auVar96 = vfmadd213ps_avx512vl(auVar133,auVar98,auVar20);
              auVar42._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar42._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar42._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar42._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar43._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar43._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar43._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar43._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar88 = vfmsub213ps_fma(auVar90,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar42);
              auVar89 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar43);
              auVar93 = vfmsub213ps_fma(auVar93,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar94 = vfmsub213ps_fma(auVar94,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar42);
              auVar95 = vfmsub213ps_fma(auVar95,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar43);
              auVar96 = vfmsub213ps_fma(auVar96,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar90 = vpminsd_avx(auVar88,auVar94);
              auVar91 = vpminsd_avx(auVar89,auVar95);
              auVar90 = vpmaxsd_avx(auVar90,auVar91);
              auVar91 = vpminsd_avx(auVar93,auVar96);
              auVar90 = vpmaxsd_avx(auVar90,auVar91);
              auVar91 = vpmaxsd_avx(auVar88,auVar94);
              auVar88 = vpmaxsd_avx(auVar89,auVar95);
              auVar88 = vpminsd_avx(auVar91,auVar88);
              auVar91 = vpmaxsd_avx(auVar93,auVar96);
              auVar88 = vpminsd_avx(auVar88,auVar91);
              auVar91 = vpmaxsd_avx(auVar90,(undefined1  [16])tray.tnear.field_0);
              auVar88 = vpminsd_avx(auVar88,(undefined1  [16])tray.tfar.field_0);
              uVar12 = vcmpps_avx512vl(auVar91,auVar88,2);
              bVar67 = (byte)uVar12;
              if ((uVar83 & 7) == 6) {
                uVar82 = *(undefined4 *)(uVar86 + 0x100 + lVar71);
                auVar21._4_4_ = uVar82;
                auVar21._0_4_ = uVar82;
                auVar21._8_4_ = uVar82;
                auVar21._12_4_ = uVar82;
                uVar12 = vcmpps_avx512vl(auVar98,auVar21,1);
                uVar82 = *(undefined4 *)(uVar86 + 0xf0 + lVar71);
                auVar22._4_4_ = uVar82;
                auVar22._0_4_ = uVar82;
                auVar22._8_4_ = uVar82;
                auVar22._12_4_ = uVar82;
                uVar13 = vcmpps_avx512vl(auVar98,auVar22,0xd);
                bVar67 = (byte)uVar12 & (byte)uVar13 & bVar67;
              }
              bVar67 = bVar67 & (byte)uVar11;
              sVar76 = root.ptr;
              auVar97 = auVar92;
              if (bVar67 != 0) {
                auVar90 = vblendmps_avx512vl(auVar146._0_16_,auVar90);
                auVar97._0_4_ =
                     (uint)(bVar67 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar98._0_4_;
                bVar66 = (bool)(bVar67 >> 1 & 1);
                auVar97._4_4_ = (uint)bVar66 * auVar90._4_4_ | (uint)!bVar66 * auVar98._4_4_;
                bVar66 = (bool)(bVar67 >> 2 & 1);
                auVar97._8_4_ = (uint)bVar66 * auVar90._8_4_ | (uint)!bVar66 * auVar98._8_4_;
                bVar66 = (bool)(bVar67 >> 3 & 1);
                auVar97._12_4_ = (uint)bVar66 * auVar90._12_4_ | (uint)!bVar66 * auVar98._12_4_;
                sVar76 = sVar4;
                if (root.ptr != 8) {
                  pNVar84->ptr = root.ptr;
                  pNVar84 = pNVar84 + 1;
                  *(undefined1 (*) [16])paVar75->v = auVar92;
                  paVar75 = paVar75 + 1;
                }
              }
              auVar92 = auVar97;
              root.ptr = sVar76;
            }
            if (root.ptr == 8) goto LAB_01c8e39a;
            uVar11 = vcmpps_avx512vl(auVar92,(undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar80 < (byte)POPCOUNT((int)uVar11));
          pNVar84->ptr = root.ptr;
          pNVar84 = pNVar84 + 1;
          *(undefined1 (*) [16])paVar75->v = auVar92;
          paVar75 = paVar75 + 1;
LAB_01c8e39a:
          iVar68 = 4;
        }
        else {
          while( true ) {
            auVar92 = auVar147._0_16_;
            if (uVar86 == 0) break;
            sVar4 = 0;
            for (uVar87 = uVar86; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
              sVar4 = sVar4 + 1;
            }
            uVar86 = uVar86 - 1 & uVar86;
            bVar66 = occluded1(local_1978,local_1980,root,sVar4,&pre,ray,&tray,context);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar148 = ZEXT1664(auVar98);
            auVar92 = vxorps_avx512vl(auVar92,auVar92);
            auVar147 = ZEXT1664(auVar92);
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar146 = ZEXT1664(auVar92);
            bVar67 = (byte)(1 << ((uint)sVar4 & 0x1f));
            if (!bVar66) {
              bVar67 = 0;
            }
            local_1a58 = (uint)((byte)local_1a58 | bVar67);
          }
          iVar68 = 3;
          auVar143 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_1a58 != 0xf) {
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1a58 & 1) * auVar92._0_4_ |
                 (uint)!(bool)((byte)local_1a58 & 1) * tray.tfar.field_0.i[0];
            bVar66 = (bool)((byte)(local_1a58 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * tray.tfar.field_0.i[1];
            bVar66 = (bool)((byte)(local_1a58 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * tray.tfar.field_0.i[2];
            bVar66 = (bool)((byte)(local_1a58 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * tray.tfar.field_0.i[3];
            iVar68 = 2;
          }
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar145 = ZEXT1664(auVar92);
          if (uVar80 < (uint)POPCOUNT(uVar82)) goto LAB_01c8e1b6;
        }
      } while ((iVar68 == 4) || (iVar68 == 2));
LAB_01c8efe0:
      local_1a58._0_1_ = (byte)local_1a58 & bVar85;
      bVar66 = (bool)((byte)local_1a58 >> 1 & 1);
      bVar8 = (bool)((byte)local_1a58 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)((byte)local_1a58 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_1a58 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar66 * -0x800000 | (uint)!bVar66 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_1a58 >> 3) * -0x800000 |
           (uint)!(bool)((byte)local_1a58 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
LAB_01c8e4f3:
  do {
    if (lVar71 == local_1970) goto LAB_01c8efa5;
    lVar77 = lVar71 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    uVar86 = 0;
    uVar70 = (ulong)bVar67;
    for (uVar87 = uVar70; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
      uVar86 = uVar86 + 1;
    }
    lVar73 = 0;
    bVar81 = bVar67;
    do {
      if ((lVar73 == 4) || (*(int *)(lVar77 + 0x40 + lVar73 * 4) == -1)) goto LAB_01c8ef89;
      pRVar5 = (context->scene->geometries).items;
      pGVar6 = pRVar5[*(uint *)(lVar77 + 0x30 + lVar73 * 4)].ptr;
      fVar110 = (pGVar6->time_range).lower;
      auVar98._4_4_ = fVar110;
      auVar98._0_4_ = fVar110;
      auVar98._8_4_ = fVar110;
      auVar98._12_4_ = fVar110;
      fVar112 = pGVar6->fnumTimeSegments;
      auVar95._4_4_ = fVar112;
      auVar95._0_4_ = fVar112;
      auVar95._8_4_ = fVar112;
      auVar95._12_4_ = fVar112;
      auVar92 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar98);
      fVar110 = (pGVar6->time_range).upper - fVar110;
      auVar93._4_4_ = fVar110;
      auVar93._0_4_ = fVar110;
      auVar93._8_4_ = fVar110;
      auVar93._12_4_ = fVar110;
      auVar92 = vdivps_avx(auVar92,auVar93);
      auVar94._0_4_ = fVar112 * auVar92._0_4_;
      auVar94._4_4_ = fVar112 * auVar92._4_4_;
      auVar94._8_4_ = fVar112 * auVar92._8_4_;
      auVar94._12_4_ = fVar112 * auVar92._12_4_;
      auVar92 = vroundps_avx(auVar94,1);
      auVar98 = vaddss_avx512f(auVar95,SUB6416(ZEXT464(0xbf800000),0));
      auVar96._0_4_ = auVar98._0_4_;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar92 = vminps_avx(auVar92,auVar96);
      auVar90 = auVar147._0_16_;
      auVar92 = vmaxps_avx512vl(auVar92,auVar90);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar92);
      auVar92 = vsubps_avx(auVar94,auVar92);
      auVar98 = vpbroadcastd_avx512vl();
      uVar11 = vpcmpeqd_avx512vl(auVar98,(undefined1  [16])itime.field_0);
      auVar98 = auVar145._0_16_;
      uVar74 = uVar70;
      uVar87 = uVar86;
      if ((byte)((byte)uVar11 & 0xf | bVar67 ^ 0xf) == 0xf) {
        lVar72 = (long)itime.field_0.i[uVar86] * 0x38;
        lVar78 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar72);
        lVar72 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar72);
        uVar87 = (ulong)*(uint *)(lVar77 + lVar73 * 4);
        uVar74 = (ulong)*(uint *)(lVar77 + 0x10 + lVar73 * 4);
        auVar91 = vsubps_avx512vl(auVar98,auVar92);
        uVar82 = *(undefined4 *)(lVar72 + uVar87 * 4);
        auVar23._4_4_ = uVar82;
        auVar23._0_4_ = uVar82;
        auVar23._8_4_ = uVar82;
        auVar23._12_4_ = uVar82;
        auVar88 = vmulps_avx512vl(auVar92,auVar23);
        uVar82 = *(undefined4 *)(lVar72 + 4 + uVar87 * 4);
        auVar24._4_4_ = uVar82;
        auVar24._0_4_ = uVar82;
        auVar24._8_4_ = uVar82;
        auVar24._12_4_ = uVar82;
        auVar89 = vmulps_avx512vl(auVar92,auVar24);
        uVar82 = *(undefined4 *)(lVar72 + 8 + uVar87 * 4);
        auVar25._4_4_ = uVar82;
        auVar25._0_4_ = uVar82;
        auVar25._8_4_ = uVar82;
        auVar25._12_4_ = uVar82;
        auVar93 = vmulps_avx512vl(auVar92,auVar25);
        uVar82 = *(undefined4 *)(lVar78 + uVar87 * 4);
        auVar26._4_4_ = uVar82;
        auVar26._0_4_ = uVar82;
        auVar26._8_4_ = uVar82;
        auVar26._12_4_ = uVar82;
        auVar99 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar26);
        uVar82 = *(undefined4 *)(lVar78 + 4 + uVar87 * 4);
        auVar27._4_4_ = uVar82;
        auVar27._0_4_ = uVar82;
        auVar27._8_4_ = uVar82;
        auVar27._12_4_ = uVar82;
        auVar100 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar27);
        uVar82 = *(undefined4 *)(lVar78 + 8 + uVar87 * 4);
        auVar28._4_4_ = uVar82;
        auVar28._0_4_ = uVar82;
        auVar28._8_4_ = uVar82;
        auVar28._12_4_ = uVar82;
        auVar101 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar28);
        uVar82 = *(undefined4 *)(lVar72 + uVar74 * 4);
        auVar29._4_4_ = uVar82;
        auVar29._0_4_ = uVar82;
        auVar29._8_4_ = uVar82;
        auVar29._12_4_ = uVar82;
        auVar88 = vmulps_avx512vl(auVar92,auVar29);
        uVar82 = *(undefined4 *)(lVar72 + 4 + uVar74 * 4);
        auVar30._4_4_ = uVar82;
        auVar30._0_4_ = uVar82;
        auVar30._8_4_ = uVar82;
        auVar30._12_4_ = uVar82;
        auVar89 = vmulps_avx512vl(auVar92,auVar30);
        uVar82 = *(undefined4 *)(lVar72 + 8 + uVar74 * 4);
        auVar31._4_4_ = uVar82;
        auVar31._0_4_ = uVar82;
        auVar31._8_4_ = uVar82;
        auVar31._12_4_ = uVar82;
        auVar93 = vmulps_avx512vl(auVar92,auVar31);
        uVar82 = *(undefined4 *)(lVar78 + uVar74 * 4);
        auVar32._4_4_ = uVar82;
        auVar32._0_4_ = uVar82;
        auVar32._8_4_ = uVar82;
        auVar32._12_4_ = uVar82;
        auVar102 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar32);
        uVar82 = *(undefined4 *)(lVar78 + 4 + uVar74 * 4);
        auVar33._4_4_ = uVar82;
        auVar33._0_4_ = uVar82;
        auVar33._8_4_ = uVar82;
        auVar33._12_4_ = uVar82;
        auVar103 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar33);
        uVar82 = *(undefined4 *)(lVar78 + 8 + uVar74 * 4);
        auVar34._4_4_ = uVar82;
        auVar34._0_4_ = uVar82;
        auVar34._8_4_ = uVar82;
        auVar34._12_4_ = uVar82;
        auVar104 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar34);
        uVar87 = (ulong)*(uint *)(lVar77 + 0x20 + lVar73 * 4);
        uVar82 = *(undefined4 *)(lVar72 + uVar87 * 4);
        auVar35._4_4_ = uVar82;
        auVar35._0_4_ = uVar82;
        auVar35._8_4_ = uVar82;
        auVar35._12_4_ = uVar82;
        auVar88 = vmulps_avx512vl(auVar92,auVar35);
        uVar82 = *(undefined4 *)(lVar72 + 4 + uVar87 * 4);
        auVar36._4_4_ = uVar82;
        auVar36._0_4_ = uVar82;
        auVar36._8_4_ = uVar82;
        auVar36._12_4_ = uVar82;
        auVar89 = vmulps_avx512vl(auVar92,auVar36);
        uVar82 = *(undefined4 *)(lVar72 + 8 + uVar87 * 4);
        auVar37._4_4_ = uVar82;
        auVar37._0_4_ = uVar82;
        auVar37._8_4_ = uVar82;
        auVar37._12_4_ = uVar82;
        auVar92 = vmulps_avx512vl(auVar92,auVar37);
        uVar82 = *(undefined4 *)(lVar78 + uVar87 * 4);
        auVar38._4_4_ = uVar82;
        auVar38._0_4_ = uVar82;
        auVar38._8_4_ = uVar82;
        auVar38._12_4_ = uVar82;
        auVar105 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar38);
        uVar82 = *(undefined4 *)(lVar78 + 4 + uVar87 * 4);
        auVar39._4_4_ = uVar82;
        auVar39._0_4_ = uVar82;
        auVar39._8_4_ = uVar82;
        auVar39._12_4_ = uVar82;
        auVar106 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar39);
        uVar82 = *(undefined4 *)(lVar78 + 8 + uVar87 * 4);
        auVar40._4_4_ = uVar82;
        auVar40._0_4_ = uVar82;
        auVar40._8_4_ = uVar82;
        auVar40._12_4_ = uVar82;
        auVar107 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar40);
      }
      else {
        while (uVar74 != 0) {
          lVar78 = (long)itime.field_0.i[uVar87] * 0x38;
          uVar79 = (ulong)*(uint *)(lVar77 + lVar73 * 4);
          auVar91 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar78) + uVar79 * 4);
          auVar88 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar78) + uVar79 * 4);
          *(int *)((long)&p0.field_0 + uVar87 * 4) = auVar91._0_4_;
          uVar82 = vextractps_avx(auVar91,1);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x10) = uVar82;
          uVar82 = vextractps_avx(auVar91,2);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x20) = uVar82;
          *(int *)((long)&p1.field_0 + uVar87 * 4) = auVar88._0_4_;
          uVar82 = vextractps_avx(auVar88,1);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x10) = uVar82;
          uVar82 = vextractps_avx(auVar88,2);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x20) = uVar82;
          uVar79 = uVar87 & 0x3f;
          uVar87 = 0;
          uVar74 = uVar74 ^ 1L << uVar79;
          for (uVar79 = uVar74; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            uVar87 = uVar87 + 1;
          }
        }
        auVar91 = vsubps_avx512vl(auVar98,auVar92);
        uVar50 = p0.field_0._0_4_;
        uVar52 = p0.field_0._4_4_;
        uVar54 = p0.field_0._8_4_;
        uVar56 = p0.field_0._12_4_;
        uVar58 = p0.field_0._32_4_;
        uVar60 = p0.field_0._36_4_;
        uVar62 = p0.field_0._40_4_;
        uVar64 = p0.field_0._44_4_;
        fVar120 = auVar91._0_4_;
        fVar123 = auVar91._4_4_;
        fVar124 = auVar91._8_4_;
        fVar125 = auVar91._12_4_;
        uVar82 = p1.field_0._0_4_;
        uVar44 = p1.field_0._4_4_;
        uVar46 = p1.field_0._8_4_;
        uVar48 = p1.field_0._12_4_;
        fVar110 = auVar92._0_4_;
        fVar112 = auVar92._4_4_;
        fVar113 = auVar92._8_4_;
        fVar114 = auVar92._12_4_;
        auVar100._0_4_ = fVar120 * (float)p0.field_0._16_4_ + fVar110 * (float)p1.field_0._16_4_;
        auVar100._4_4_ = fVar123 * (float)p0.field_0._20_4_ + fVar112 * (float)p1.field_0._20_4_;
        auVar100._8_4_ = fVar124 * (float)p0.field_0._24_4_ + fVar113 * (float)p1.field_0._24_4_;
        auVar100._12_4_ = fVar125 * (float)p0.field_0._28_4_ + fVar114 * (float)p1.field_0._28_4_;
        fVar128 = fVar110 * (float)p1.field_0._32_4_;
        fVar130 = fVar112 * (float)p1.field_0._36_4_;
        fVar131 = fVar113 * (float)p1.field_0._40_4_;
        fVar132 = fVar114 * (float)p1.field_0._44_4_;
        uVar74 = uVar70;
        uVar87 = uVar86;
        while (uVar74 != 0) {
          lVar78 = (long)itime.field_0.i[uVar87] * 0x38;
          uVar79 = (ulong)*(uint *)(lVar77 + 0x10 + lVar73 * 4);
          auVar92 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar78) + uVar79 * 4);
          auVar91 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar78) + uVar79 * 4);
          *(int *)((long)&p0.field_0 + uVar87 * 4) = auVar92._0_4_;
          uVar3 = vextractps_avx(auVar92,1);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar92,2);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar87 * 4) = auVar91._0_4_;
          uVar3 = vextractps_avx(auVar91,1);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar91,2);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x20) = uVar3;
          uVar79 = uVar87 & 0x3f;
          uVar87 = 0;
          uVar74 = uVar74 ^ 1L << uVar79;
          for (uVar79 = uVar74; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            uVar87 = uVar87 + 1;
          }
        }
        uVar51 = p0.field_0._0_4_;
        uVar53 = p0.field_0._4_4_;
        uVar55 = p0.field_0._8_4_;
        uVar57 = p0.field_0._12_4_;
        uVar59 = p0.field_0._32_4_;
        uVar61 = p0.field_0._36_4_;
        uVar63 = p0.field_0._40_4_;
        uVar65 = p0.field_0._44_4_;
        uVar3 = p1.field_0._0_4_;
        uVar45 = p1.field_0._4_4_;
        uVar47 = p1.field_0._8_4_;
        uVar49 = p1.field_0._12_4_;
        auVar99._0_4_ = fVar120 * (float)uVar50 + fVar110 * (float)uVar82;
        auVar99._4_4_ = fVar123 * (float)uVar52 + fVar112 * (float)uVar44;
        auVar99._8_4_ = fVar124 * (float)uVar54 + fVar113 * (float)uVar46;
        auVar99._12_4_ = fVar125 * (float)uVar56 + fVar114 * (float)uVar48;
        auVar103._0_4_ = fVar120 * (float)p0.field_0._16_4_ + fVar110 * (float)p1.field_0._16_4_;
        auVar103._4_4_ = fVar123 * (float)p0.field_0._20_4_ + fVar112 * (float)p1.field_0._20_4_;
        auVar103._8_4_ = fVar124 * (float)p0.field_0._24_4_ + fVar113 * (float)p1.field_0._24_4_;
        auVar103._12_4_ = fVar125 * (float)p0.field_0._28_4_ + fVar114 * (float)p1.field_0._28_4_;
        fVar137 = fVar110 * (float)p1.field_0._32_4_;
        fVar139 = fVar112 * (float)p1.field_0._36_4_;
        fVar140 = fVar113 * (float)p1.field_0._40_4_;
        fVar141 = fVar114 * (float)p1.field_0._44_4_;
        uVar74 = uVar70;
        uVar87 = uVar86;
        while (uVar74 != 0) {
          lVar78 = (long)itime.field_0.i[uVar87] * 0x38;
          uVar79 = (ulong)*(uint *)(lVar77 + 0x20 + lVar73 * 4);
          auVar92 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar78) + uVar79 * 4);
          auVar91 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar78) + uVar79 * 4);
          *(int *)((long)&p0.field_0 + uVar87 * 4) = auVar92._0_4_;
          uVar82 = vextractps_avx(auVar92,1);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x10) = uVar82;
          uVar82 = vextractps_avx(auVar92,2);
          *(undefined4 *)((long)&p0.field_0 + uVar87 * 4 + 0x20) = uVar82;
          *(int *)((long)&p1.field_0 + uVar87 * 4) = auVar91._0_4_;
          uVar82 = vextractps_avx(auVar91,1);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x10) = uVar82;
          uVar82 = vextractps_avx(auVar91,2);
          *(undefined4 *)((long)&p1.field_0 + uVar87 * 4 + 0x20) = uVar82;
          uVar79 = uVar87 & 0x3f;
          uVar87 = 0;
          uVar74 = uVar74 ^ 1L << uVar79;
          for (uVar79 = uVar74; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            uVar87 = uVar87 + 1;
          }
        }
        auVar101._0_4_ = fVar120 * (float)uVar58 + fVar128;
        auVar101._4_4_ = fVar123 * (float)uVar60 + fVar130;
        auVar101._8_4_ = fVar124 * (float)uVar62 + fVar131;
        auVar101._12_4_ = fVar125 * (float)uVar64 + fVar132;
        auVar104._0_4_ = fVar137 + (float)uVar59 * fVar120;
        auVar104._4_4_ = fVar139 + (float)uVar61 * fVar123;
        auVar104._8_4_ = fVar140 + (float)uVar63 * fVar124;
        auVar104._12_4_ = fVar141 + (float)uVar65 * fVar125;
        auVar102._0_4_ = (float)uVar3 * fVar110 + fVar120 * (float)uVar51;
        auVar102._4_4_ = (float)uVar45 * fVar112 + fVar123 * (float)uVar53;
        auVar102._8_4_ = (float)uVar47 * fVar113 + fVar124 * (float)uVar55;
        auVar102._12_4_ = (float)uVar49 * fVar114 + fVar125 * (float)uVar57;
        auVar105._0_4_ = fVar120 * (float)p0.field_0._0_4_ + fVar110 * (float)p1.field_0._0_4_;
        auVar105._4_4_ = fVar123 * (float)p0.field_0._4_4_ + fVar112 * (float)p1.field_0._4_4_;
        auVar105._8_4_ = fVar124 * (float)p0.field_0._8_4_ + fVar113 * (float)p1.field_0._8_4_;
        auVar105._12_4_ = fVar125 * (float)p0.field_0._12_4_ + fVar114 * (float)p1.field_0._12_4_;
        auVar106._0_4_ = fVar120 * (float)p0.field_0._16_4_ + fVar110 * (float)p1.field_0._16_4_;
        auVar106._4_4_ = fVar123 * (float)p0.field_0._20_4_ + fVar112 * (float)p1.field_0._20_4_;
        auVar106._8_4_ = fVar124 * (float)p0.field_0._24_4_ + fVar113 * (float)p1.field_0._24_4_;
        auVar106._12_4_ = fVar125 * (float)p0.field_0._28_4_ + fVar114 * (float)p1.field_0._28_4_;
        auVar107._0_4_ = fVar120 * (float)p0.field_0._32_4_ + fVar110 * (float)p1.field_0._32_4_;
        auVar107._4_4_ = fVar123 * (float)p0.field_0._36_4_ + fVar112 * (float)p1.field_0._36_4_;
        auVar107._8_4_ = fVar124 * (float)p0.field_0._40_4_ + fVar113 * (float)p1.field_0._40_4_;
        auVar107._12_4_ = fVar125 * (float)p0.field_0._44_4_ + fVar114 * (float)p1.field_0._44_4_;
      }
      local_1718 = *(undefined8 *)(lVar77 + 0x30);
      uStack_1710 = *(undefined8 *)(lVar77 + 0x38);
      auVar89 = vsubps_avx(auVar99,auVar102);
      auVar93 = vsubps_avx(auVar100,auVar103);
      auVar94 = vsubps_avx(auVar101,auVar104);
      auVar95 = vsubps_avx(auVar105,auVar99);
      auVar96 = vsubps_avx(auVar106,auVar100);
      auVar102 = vsubps_avx512vl(auVar107,auVar101);
      auVar92 = vmulps_avx512vl(auVar93,auVar102);
      auVar107 = vfmsub231ps_fma(auVar92,auVar96,auVar94);
      auVar119._0_4_ = auVar94._0_4_ * auVar95._0_4_;
      auVar119._4_4_ = auVar94._4_4_ * auVar95._4_4_;
      auVar119._8_4_ = auVar94._8_4_ * auVar95._8_4_;
      auVar119._12_4_ = auVar94._12_4_ * auVar95._12_4_;
      auVar104 = vfmsub231ps_avx512vl(auVar119,auVar102,auVar89);
      auVar122._0_4_ = auVar89._0_4_ * auVar96._0_4_;
      auVar122._4_4_ = auVar89._4_4_ * auVar96._4_4_;
      auVar122._8_4_ = auVar89._8_4_ * auVar96._8_4_;
      auVar122._12_4_ = auVar89._12_4_ * auVar96._12_4_;
      aVar14 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmsub231ps_fma(auVar122,auVar95,auVar93);
      auVar99 = vsubps_avx(auVar99,*(undefined1 (*) [16])ray);
      auVar100 = vsubps_avx(auVar100,*(undefined1 (*) [16])(ray + 0x10));
      auVar103 = vsubps_avx(auVar101,*(undefined1 (*) [16])(ray + 0x20));
      auVar92 = *(undefined1 (*) [16])(ray + 0x40);
      auVar91 = *(undefined1 (*) [16])(ray + 0x50);
      auVar88 = *(undefined1 (*) [16])(ray + 0x60);
      auVar105 = vmulps_avx512vl(auVar91,auVar103);
      auVar105 = vfmsub231ps_fma(auVar105,auVar100,auVar88);
      auVar142._0_4_ = auVar88._0_4_ * auVar99._0_4_;
      auVar142._4_4_ = auVar88._4_4_ * auVar99._4_4_;
      auVar142._8_4_ = auVar88._8_4_ * auVar99._8_4_;
      auVar142._12_4_ = auVar88._12_4_ * auVar99._12_4_;
      auVar101 = vfmsub231ps_fma(auVar142,auVar103,auVar92);
      auVar144._0_4_ = auVar92._0_4_ * auVar100._0_4_;
      auVar144._4_4_ = auVar92._4_4_ * auVar100._4_4_;
      auVar144._8_4_ = auVar92._8_4_ * auVar100._8_4_;
      auVar144._12_4_ = auVar92._12_4_ * auVar100._12_4_;
      auVar106 = vfmsub231ps_avx512vl(auVar144,auVar99,auVar91);
      auVar127._0_4_ = aVar14.v[0] * auVar88._0_4_;
      auVar127._4_4_ = aVar14.v[1] * auVar88._4_4_;
      auVar127._8_4_ = aVar14.v[2] * auVar88._8_4_;
      auVar127._12_4_ = aVar14.v[3] * auVar88._12_4_;
      auVar91 = vfmadd231ps_avx512vl(auVar127,auVar104,auVar91);
      auVar92 = vfmadd231ps_fma(auVar91,auVar107,auVar92);
      auVar91 = vandps_avx512vl(auVar92,auVar148._0_16_);
      auVar88 = vmulps_avx512vl(auVar102,auVar106);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,auVar96);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar105,auVar95);
      auVar88 = vxorps_avx512vl(auVar91,auVar88);
      uVar11 = vcmpps_avx512vl(auVar88,auVar90,5);
      bVar69 = (byte)uVar11 & bVar81;
      if (bVar69 == 0) {
        bVar69 = 0;
      }
      else {
        auVar138._0_4_ = auVar94._0_4_ * auVar106._0_4_;
        auVar138._4_4_ = auVar94._4_4_ * auVar106._4_4_;
        auVar138._8_4_ = auVar94._8_4_ * auVar106._8_4_;
        auVar138._12_4_ = auVar94._12_4_ * auVar106._12_4_;
        auVar93 = vfmadd213ps_fma(auVar101,auVar93,auVar138);
        auVar89 = vfmadd213ps_fma(auVar105,auVar89,auVar93);
        auVar136._0_4_ = auVar91._0_4_ ^ auVar89._0_4_;
        auVar136._4_4_ = auVar91._4_4_ ^ auVar89._4_4_;
        auVar136._8_4_ = auVar91._8_4_ ^ auVar89._8_4_;
        auVar136._12_4_ = auVar91._12_4_ ^ auVar89._12_4_;
        uVar11 = vcmpps_avx512vl(auVar136,auVar90,5);
        bVar69 = bVar69 & (byte)uVar11;
        if (bVar69 != 0) {
          auVar41._8_4_ = 0x7fffffff;
          auVar41._0_8_ = 0x7fffffff7fffffff;
          auVar41._12_4_ = 0x7fffffff;
          auVar89 = vandps_avx512vl(auVar92,auVar41);
          auVar88 = vsubps_avx(auVar89,auVar88);
          uVar11 = vcmpps_avx512vl(auVar88,auVar136,5);
          bVar69 = bVar69 & (byte)uVar11;
          if (bVar69 != 0) {
            auVar134._0_4_ = aVar14.v[0] * auVar103._0_4_;
            auVar134._4_4_ = aVar14.v[1] * auVar103._4_4_;
            auVar134._8_4_ = aVar14.v[2] * auVar103._8_4_;
            auVar134._12_4_ = aVar14.v[3] * auVar103._12_4_;
            auVar88 = vfmadd213ps_fma(auVar100,auVar104,auVar134);
            auVar88 = vfmadd213ps_fma(auVar99,auVar107,auVar88);
            auVar135._0_4_ = auVar89._0_4_ * *(float *)(ray + 0x30);
            auVar135._4_4_ = auVar89._4_4_ * *(float *)(ray + 0x34);
            auVar135._8_4_ = auVar89._8_4_ * *(float *)(ray + 0x38);
            auVar135._12_4_ = auVar89._12_4_ * *(float *)(ray + 0x3c);
            auVar115._0_4_ = auVar91._0_4_ ^ auVar88._0_4_;
            auVar115._4_4_ = auVar91._4_4_ ^ auVar88._4_4_;
            auVar115._8_4_ = auVar91._8_4_ ^ auVar88._8_4_;
            auVar115._12_4_ = auVar91._12_4_ ^ auVar88._12_4_;
            auVar117._0_4_ = auVar89._0_4_ * *(float *)(ray + 0x80);
            auVar117._4_4_ = auVar89._4_4_ * *(float *)(ray + 0x84);
            auVar117._8_4_ = auVar89._8_4_ * *(float *)(ray + 0x88);
            auVar117._12_4_ = auVar89._12_4_ * *(float *)(ray + 0x8c);
            uVar11 = vcmpps_avx512vl(auVar115,auVar117,2);
            uVar12 = vcmpps_avx512vl(auVar135,auVar115,1);
            bVar69 = bVar69 & (byte)uVar11 & (byte)uVar12;
            if (bVar69 == 0) {
LAB_01c8ef82:
              bVar69 = 0;
              aVar14 = local_18a8;
              auVar104 = local_1898;
              auVar107 = local_1888;
              auVar89 = local_1878;
            }
            else {
              uVar11 = vcmpps_avx512vl(auVar92,ZEXT816(0) << 0x20,4);
              bVar69 = bVar69 & (byte)uVar11;
              if (bVar69 == 0) goto LAB_01c8ef82;
            }
            local_1878 = auVar89;
            local_1888 = auVar107;
            local_1898 = auVar104;
            local_18a8 = aVar14;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar146 = ZEXT1664(auVar92);
            auVar92 = vxorps_avx512vl(auVar90,auVar90);
            auVar147 = ZEXT1664(auVar92);
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar148 = ZEXT1664(auVar92);
            goto LAB_01c8e78a;
          }
        }
        bVar69 = 0;
      }
LAB_01c8e78a:
      auVar92 = auVar147._0_16_;
      pGVar6 = pRVar5[*(uint *)((long)&local_1718 + lVar73 * 4)].ptr;
      uVar83 = pGVar6->mask;
      auVar111._4_4_ = uVar83;
      auVar111._0_4_ = uVar83;
      auVar111._8_4_ = uVar83;
      auVar111._12_4_ = uVar83;
      uVar11 = vptestmd_avx512vl(auVar111,*(undefined1 (*) [16])(ray + 0x90));
      bVar69 = (byte)uVar11 & 0xf & bVar69;
      uVar87 = (ulong)bVar69;
      if (bVar69 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar90 = vrcp14ps_avx512vl(local_1878);
          auVar98 = vfnmadd213ps_avx512vl(auVar90,local_1878,auVar98);
          vfmadd132ps_fma(auVar98,auVar90,auVar90);
          p0.field_0._0_8_ = local_1888._0_8_;
          p0.field_0._8_8_ = local_1888._8_8_;
          p0.field_0._16_8_ = local_1898._0_8_;
          p0.field_0._24_8_ = local_1898._8_8_;
          p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_18a8;
          p1.field_0._0_8_ = &itime;
          p1.field_0._8_8_ = &t;
          p1.field_0._16_8_ = &v;
          p1.field_0._24_8_ = &u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                             *)&p0);
          auVar98 = vpbroadcastd_avx512vl();
          vpbroadcastd_avx512vl();
          p0.field_0._0_8_ = itime.field_0.v[0];
          p0.field_0._8_8_ = itime.field_0.v[1];
          p0.field_0._16_8_ = local_18c8;
          p0.field_0._24_8_ = uStack_18c0;
          p0.field_0._40_8_ = uStack_18b0;
          p0.field_0._32_8_ = uStack_18b8;
          vpcmpeqd_avx2(ZEXT1632(auVar98),ZEXT1632(auVar98));
          uVar83 = context->user->instPrimID[0];
          auVar98 = *(undefined1 (*) [16])(ray + 0x80);
          auVar90 = vblendmps_avx512vl(auVar98,(undefined1  [16])t.field_0);
          bVar66 = (bool)(bVar69 >> 1 & 1);
          bVar8 = (bool)(bVar69 >> 2 & 1);
          *(uint *)(ray + 0x80) = (uint)(bVar69 & 1) * auVar90._0_4_ | !(bool)(bVar69 & 1) * uVar83;
          *(uint *)(ray + 0x84) = (uint)bVar66 * auVar90._4_4_ | !bVar66 * uVar83;
          *(uint *)(ray + 0x88) = (uint)bVar8 * auVar90._8_4_ | !bVar8 * uVar83;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar69 >> 3) * auVar90._12_4_ | !(bool)(bVar69 >> 3) * uVar83;
          local_1998 = vpmovm2d_avx512vl(uVar87);
          p1.field_0._0_8_ = local_1998;
          p1.field_0._8_8_ = pGVar6->userPtr;
          p1.field_0._16_8_ = context->user;
          p1.field_0._32_8_ = &p0;
          p1.field_0._40_4_ = 4;
          p1.field_0._24_8_ = ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
          }
          uVar87 = vptestmd_avx512vl(local_1998,local_1998);
          if ((uVar87 & 0xf) == 0) {
            uVar87 = 0;
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar145 = ZEXT1664(auVar90);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar146 = ZEXT1664(auVar90);
            auVar92 = vxorps_avx512vl(auVar92,auVar92);
            auVar147 = ZEXT1664(auVar92);
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar148 = ZEXT1664(auVar92);
          }
          else {
            p_Var7 = context->args->filter;
            if (p_Var7 == (RTCFilterFunctionN)0x0) {
              auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar145 = ZEXT1664(auVar90);
              auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar146 = ZEXT1664(auVar90);
              auVar92 = vxorps_avx512vl(auVar92,auVar92);
              auVar147 = ZEXT1664(auVar92);
              auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar148 = ZEXT1664(auVar92);
            }
            else {
              auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar145 = ZEXT1664(auVar90);
              auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar146 = ZEXT1664(auVar90);
              auVar92 = vxorps_avx512vl(auVar92,auVar92);
              auVar147 = ZEXT1664(auVar92);
              auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar148 = ZEXT1664(auVar90);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar148 = ZEXT1664(auVar90);
                auVar92 = vxorps_avx512vl(auVar92,auVar92);
                auVar147 = ZEXT1664(auVar92);
                auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar146 = ZEXT1664(auVar92);
                auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar145 = ZEXT1664(auVar92);
              }
            }
            uVar87 = vptestmd_avx512vl(local_1998,local_1998);
            uVar87 = uVar87 & 0xf;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar66 = (bool)((byte)uVar87 & 1);
            auVar108._0_4_ =
                 (uint)bVar66 * auVar92._0_4_ | (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x80);
            bVar66 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar108._4_4_ =
                 (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x84);
            bVar66 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar108._8_4_ =
                 (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x88);
            bVar66 = SUB81(uVar87 >> 3,0);
            auVar108._12_4_ =
                 (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x8c);
            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar108;
          }
          bVar66 = (bool)((byte)uVar87 & 1);
          auVar109._0_4_ = (uint)bVar66 * *(int *)pRVar1 | (uint)!bVar66 * auVar98._0_4_;
          bVar66 = (bool)((byte)(uVar87 >> 1) & 1);
          auVar109._4_4_ = (uint)bVar66 * *(int *)(ray + 0x84) | (uint)!bVar66 * auVar98._4_4_;
          bVar66 = (bool)((byte)(uVar87 >> 2) & 1);
          auVar109._8_4_ = (uint)bVar66 * *(int *)(ray + 0x88) | (uint)!bVar66 * auVar98._8_4_;
          bVar66 = SUB81(uVar87 >> 3,0);
          auVar109._12_4_ = (uint)bVar66 * *(int *)(ray + 0x8c) | (uint)!bVar66 * auVar98._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar109;
        }
        bVar81 = ((byte)uVar87 ^ 0xf) & bVar81;
      }
      lVar73 = lVar73 + 1;
    } while (bVar81 != 0);
    bVar81 = 0;
LAB_01c8ef89:
    lVar71 = lVar71 + 1;
    bVar67 = bVar67 & bVar81;
  } while (bVar67 != 0);
  bVar67 = 0;
LAB_01c8efa5:
  bVar67 = ~bVar67 & 0xf | (byte)local_1a58;
  local_1a58 = (uint)bVar67;
  if (bVar67 == 0xf) {
    local_1a58._0_1_ = 0xf;
    goto LAB_01c8efe0;
  }
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar67 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar67 & 1) * tray.tfar.field_0.i[0];
  bVar66 = (bool)(bVar67 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * tray.tfar.field_0.i[1];
  bVar66 = (bool)(bVar67 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * tray.tfar.field_0.i[2];
  bVar66 = (bool)(bVar67 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * tray.tfar.field_0.i[3];
  goto LAB_01c8e176;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }